

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackData.h
# Opt level: O0

void __thiscall TrackData::TrackData(TrackData *this)

{
  TrackData *this_local;
  
  memset(this,0,8);
  CylHead::CylHead(&this->cylhead);
  this->m_type = None;
  this->m_flags = 0;
  Track::Track(&this->m_track,0);
  memset(&this->m_bitstream,0,0x68);
  BitBuffer::BitBuffer(&this->m_bitstream);
  memset(&this->m_flux,0,0x18);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->m_flux);
  this->m_normalised_flux = false;
  return;
}

Assistant:

TrackData() = default;